

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnMemory
          (SharedValidator *this,Location *loc,Limits *limits,uint32_t page_size)

{
  Result RVar1;
  uint64_t absolute_max;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  MemoryType local_48;
  
  bVar4 = false;
  if (((this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     (bVar4 = false, (this->options_).features.multi_memory_enabled_ == false)) {
    RVar1 = PrintError(this,loc,"only one memory block allowed");
    bVar4 = RVar1.enum_ == Error;
  }
  if (page_size != 0x10000) {
    if ((this->options_).features.custom_page_sizes_enabled_ == true) {
      if (page_size == 1) goto LAB_00154b71;
      pcVar2 = "only page sizes of 1 B or 64 KiB are allowed";
    }
    else {
      pcVar2 = "only default page size (64 KiB) is allowed";
    }
    RVar1 = PrintError(this,loc,pcVar2);
    bVar4 = (bool)(RVar1.enum_ == Error | bVar4);
  }
LAB_00154b71:
  absolute_max = WABT_BYTES_TO_MIN_PAGES(-(ulong)limits->is_64 | 0xffffffff,page_size);
  RVar1 = CheckLimits(this,loc,limits,absolute_max,"pages");
  bVar3 = RVar1.enum_ == Error | bVar4;
  if (limits->is_shared == true) {
    if ((this->options_).features.threads_enabled_ == true) {
      if (limits->has_max != false) goto LAB_00154be9;
      pcVar2 = "shared memories must have max sizes";
    }
    else {
      pcVar2 = "memories may not be shared";
    }
    RVar1 = PrintError(this,loc,pcVar2);
    bVar3 = bVar3 | RVar1.enum_ == Error;
  }
LAB_00154be9:
  local_48.limits.has_max = limits->has_max;
  local_48.limits.is_shared = limits->is_shared;
  local_48.limits.is_64 = limits->is_64;
  local_48.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_48.limits.initial = limits->initial;
  local_48.limits.max = limits->max;
  std::vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  ::emplace_back<wabt::SharedValidator::MemoryType>(&this->memories_,&local_48);
  return (Result)(uint)bVar3;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc,
                                 const Limits& limits,
                                 uint32_t page_size) {
  Result result = Result::Ok;
  if (memories_.size() > 0 && !options_.features.multi_memory_enabled()) {
    result |= PrintError(loc, "only one memory block allowed");
  }

  if (page_size != WABT_DEFAULT_PAGE_SIZE) {
    if (!options_.features.custom_page_sizes_enabled()) {
      result |= PrintError(loc, "only default page size (64 KiB) is allowed");
    } else if (page_size != 1) {
      result |= PrintError(loc, "only page sizes of 1 B or 64 KiB are allowed");
    }
  }

  uint64_t absolute_max = WABT_BYTES_TO_MIN_PAGES(
      (limits.is_64 ? UINT64_MAX : UINT32_MAX), page_size);
  result |= CheckLimits(loc, limits, absolute_max, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}